

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsShaderLibraryCase.cpp
# Opt level: O0

void __thiscall
deqp::gls::BeforeDrawValidator::BeforeDrawValidator
          (BeforeDrawValidator *this,Functions *gl,GLuint target,TargetType targetType)

{
  TargetType targetType_local;
  GLuint target_local;
  Functions *gl_local;
  BeforeDrawValidator *this_local;
  
  glu::DrawUtilCallback::DrawUtilCallback(&this->super_DrawUtilCallback);
  (this->super_DrawUtilCallback)._vptr_DrawUtilCallback = (_func_int **)&PTR_beforeDrawCall_015c9d98
  ;
  this->m_gl = gl;
  this->m_target = target;
  this->m_targetType = targetType;
  this->m_validateStatus = -1;
  std::__cxx11::string::string((string *)&this->m_logMessage);
  return;
}

Assistant:

BeforeDrawValidator::BeforeDrawValidator (const glw::Functions& gl, glw::GLuint target, TargetType targetType)
	: m_gl				(gl)
	, m_target			(target)
	, m_targetType		(targetType)
	, m_validateStatus	(-1)
{
	DE_ASSERT(targetType < TARGETTYPE_LAST);
}